

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O2

int GPIO::GPIOBase::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  unsigned_long *in_RAX;
  pointer __p_00;
  GPIOError *this;
  pointer __p;
  int __fd;
  AutoFile fd;
  allocator<char> local_41;
  string local_40;
  
  if (peripherals_base != 0) goto LAB_0011008b;
  if (simulate) {
    peripherals_base = 0x20000000;
    peripherals_size = 0x1000000;
    __p_00 = (pointer)operator_new__(0x2000000);
    memset(__p_00,0,0x2000000);
    local_40._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>::reset
              ((__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> *)
               &peripherals_sim,__p_00);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_40);
    peripherals = (unsigned_long *)
                  peripherals_sim._M_t.
                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  }
  else {
    fd.m_fd = -1;
    if (want_full_mapping) {
LAB_0010fe4d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"/proc/device-tree/soc/ranges",&local_41);
      bVar1 = Tools::AutoFile::open_nothrow(&fd,&local_40,0);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        Tools::AutoFile::seek(&fd,4,0);
        Tools::AutoFile::read<unsigned_long>(&fd,&peripherals_base);
        if (peripherals_base == 0) {
          Tools::AutoFile::read<unsigned_long>(&fd,&peripherals_base);
        }
        __fd = 0x119890;
        Tools::AutoFile::read<unsigned_long>(&fd,&peripherals_size);
        Tools::AutoFile::close(&fd,__fd);
        Tools::byteswap<unsigned_long>(&peripherals_base);
        Tools::byteswap<unsigned_long>(&peripherals_size);
        if (peripherals_base == 0) {
          this = (GPIOError *)__cxa_allocate_exception(0x10);
          GPIOError::runtime_error(this,"cannot read SOC peripherals base address");
          goto LAB_001100e8;
        }
        if (peripherals_size == 0) {
          this = (GPIOError *)__cxa_allocate_exception(0x10);
          GPIOError::runtime_error(this,"cannot read SOC peripherals size");
          goto LAB_001100e8;
        }
      }
      else {
        peripherals_base = 0x20000000;
        peripherals_size = 0x1000000;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/dev/mem",&local_41);
      Tools::AutoFile::open(&fd,(char *)&local_40,0x101002);
      std::__cxx11::string::~string((string *)&local_40);
      peripherals = (unsigned_long *)mmap((void *)0x0,peripherals_size,3,1,fd.m_fd,peripherals_base)
      ;
      if (peripherals == (unsigned_long *)0xffffffffffffffff) {
        this = (GPIOError *)__cxa_allocate_exception(0x10);
        GPIOError::runtime_error(this,"mmap failed on /dev/mem");
LAB_001100e8:
        __cxa_throw(this,&GPIOError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"/dev/gpiomem",&local_41);
      bVar1 = Tools::AutoFile::open_nothrow(&fd,&local_40,0x101002);
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar1) goto LAB_0010fe4d;
      gpio_addr = (unsigned_long *)mmap((void *)0x0,0x1000,3,1,fd.m_fd,0);
      if (gpio_addr == (unsigned_long *)0xffffffffffffffff) {
        this = (GPIOError *)__cxa_allocate_exception(0x10);
        GPIOError::runtime_error(this,"mmap failed on /dev/gpiomem");
        goto LAB_001100e8;
      }
      gpio_only = true;
    }
    Tools::AutoFile::~AutoFile(&fd);
  }
  if (gpio_only == true) {
    peripherals = (unsigned_long *)0x0;
    pwm_addr = (unsigned_long *)0x0;
    clk_addr = (unsigned_long *)0x0;
    pads_addr = (unsigned_long *)0x0;
    spi0_addr = (unsigned_long *)0x0;
    bsc0_addr = (unsigned_long *)0x0;
    bsc1_addr = (unsigned_long *)0x0;
    in_RAX = (unsigned_long *)0x0;
    st_addr = in_RAX;
  }
  else {
    gpio_addr = peripherals + 0x40000;
    pwm_addr = peripherals + 0x41800;
    clk_addr = peripherals + 0x20200;
    pads_addr = peripherals + 0x20000;
    spi0_addr = peripherals + 0x40800;
    bsc0_addr = peripherals + 0x40a00;
    bsc1_addr = peripherals + 0x100800;
    in_RAX = peripherals + 0x600;
    st_addr = in_RAX;
  }
LAB_0011008b:
  return (int)in_RAX;
}

Assistant:

void GPIOBase::init()
{
    if (!peripherals_base) {

#ifndef __linux
        // this GPIO is only existing in Linux type operating systems. When compiling e.g. on a Mac,
        // force simulation mode for debugging.

        simulate = true;
#endif

        // check if we are in simulation mode (probably on another hardware, like a PC or a Mac)

        if (simulate) {

            peripherals_base = 0x20000000;
            peripherals_size = 0x01000000;

            peripherals_sim = std::make_unique<unsigned long[]>(peripherals_size / 4);
            peripherals = peripherals_sim.get();

        } else {

            // use /dev/gpiomem if available (does not need root, only group gpio, but we lose access on
            // PWM and all other buses than gpio.
            // however - as all higher level protocols are well handled by Linux modules, this should not
            // be an issue. Only problem is the pwm clock frequency, which cannot be set through a kernel
            // module. See /boot/overlay/README.)

            Tools::AutoFile fd;

            if (!want_full_mapping && fd.open_nothrow("/dev/gpiomem", O_RDWR | O_SYNC)) {

                gpio_addr = static_cast<volatile unsigned long*>(::mmap(nullptr, GPIO_MEM_BLOCK_SIZE,
                                                                        (PROT_READ | PROT_WRITE),
                                                                        MAP_SHARED, *fd, 0));
                if (gpio_addr == MAP_FAILED) throw GPIOError("mmap failed on /dev/gpiomem");
                
                gpio_only = true;

            } else {

                // Try to determine peripherals_base and peripherals_size

                // The peripherals base address is announced in /proc/device-tree/soc/ranges with
                // an offset of 4 and a size of 4, followed by the size.

                // If the file does not exist it shall be assumed 0x20000000 and the size with 0x01000000
                // (which was the address on the raspi 1 versions)

                if (!fd.open_nothrow("/proc/device-tree/soc/ranges", O_RDONLY)) {

                    // this is apparently a raspi 1 with an old kernel

                    peripherals_base = 0x20000000;
                    peripherals_size = 0x01000000;

                } else {

                    // else read base address at pos 4
                    fd.seek(4, SEEK_SET);
                    fd.read(peripherals_base);

					if (peripherals_base == 0) {
						// on the raspberry pi 4 the base is at pos 8, not 4,
						// and the size is at pos 12, not 8
						// see https://github.com/raspberrypi/userland/blob/master/host_applications/linux/libs/bcm_host/bcm_host.c
						// in bcm_host_get_peripheral_address()
						fd.read(peripherals_base);
					}

                    fd.read(peripherals_size);

                    fd.close();

                    Tools::byteswap(peripherals_base);
                    Tools::byteswap(peripherals_size);

                }

                if (!peripherals_base) throw GPIOError("cannot read SOC peripherals base address");
                if (!peripherals_size) throw GPIOError("cannot read SOC peripherals size");

                fd.open("/dev/mem", O_RDWR | O_SYNC);

                peripherals = static_cast<volatile unsigned long*>(::mmap(nullptr, peripherals_size,
                                                                          (PROT_READ | PROT_WRITE),
                                                                          MAP_SHARED,
                                                                          *fd, peripherals_base));
                if (peripherals == MAP_FAILED) throw GPIOError("mmap failed on /dev/mem");

            }

        }

        if (gpio_only) {

            peripherals = nullptr;
            pwm_addr    = nullptr;
            clk_addr    = nullptr;
            pads_addr   = nullptr;
            spi0_addr   = nullptr;
            bsc0_addr   = nullptr;
            bsc1_addr   = nullptr;
            st_addr     = nullptr;

        } else {

            gpio_addr   = peripherals + GPIO_BASE  / sizeof(peripherals);
            pwm_addr    = peripherals + GPIO_PWM   / sizeof(peripherals);
            clk_addr    = peripherals + CLOCK_BASE / sizeof(peripherals);
            pads_addr   = peripherals + GPIO_PADS  / sizeof(peripherals);
            spi0_addr   = peripherals + SPI0_BASE  / sizeof(peripherals);
            bsc0_addr   = peripherals + BSC0_BASE  / sizeof(peripherals);
            bsc1_addr   = peripherals + BSC1_BASE  / sizeof(peripherals);
            st_addr     = peripherals + ST_BASE    / sizeof(peripherals);
            
        }
    }
}